

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

int __thiscall
Potassco::TheoryData::accept(TheoryData *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint uVar1;
  Id_t id;
  bool bVar2;
  undefined8 in_RAX;
  undefined7 extraout_var;
  TheoryTerm *pTVar3;
  long lVar4;
  undefined4 in_register_00000034;
  uint *puVar5;
  
  puVar5 = (uint *)CONCAT44(in_register_00000034,__fd);
  uVar1 = *puVar5;
  for (lVar4 = 0; (ulong)(uVar1 & 0x7fffffff) << 2 != lVar4; lVar4 = lVar4 + 4) {
    bVar2 = doVisitTerm(this,(VisitMode)__addr_len,*(Id_t *)((long)puVar5 + lVar4 + 4));
    in_RAX = CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      id = *(Id_t *)((long)puVar5 + lVar4 + 4);
      pTVar3 = getTerm(this,id);
      in_RAX = (**(code **)(*(long *)__addr + 0x10))(__addr,this,id,pTVar3);
    }
  }
  return (int)in_RAX;
}

Assistant:

void TheoryData::accept(const TheoryElement& e, Visitor& out, VisitMode m) const {
	for (TheoryElement::iterator it = e.begin(), end = e.end(); it != end; ++it) {
		if (doVisitTerm(m, *it)) { out.visit(*this, *it, getTerm(*it)); }
	}
}